

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O3

bool __thiscall
Assimp::FindDegeneratesProcess::ExecuteOnMesh(FindDegeneratesProcess *this,aiMesh *mesh)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  aiVector3D *paVar5;
  void *pvVar6;
  bool bVar7;
  Logger *pLVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  uint *puVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  aiFace *paVar20;
  ulong uVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  vector<bool,_std::allocator<bool>_> local_1f0;
  char *local_1c8;
  char local_1b8 [16];
  undefined1 local_1a8 [376];
  
  mesh->mPrimitiveTypes = 0;
  local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  if (this->mConfigRemoveDegenerates == true) {
    std::vector<bool,_std::allocator<bool>_>::resize(&local_1f0,(ulong)mesh->mNumFaces,false);
  }
  bVar7 = false;
  if (mesh->mNumFaces == 0) goto LAB_0014fb10;
  uVar11 = 0;
  iVar13 = 0;
  do {
    uVar9 = mesh->mFaces[uVar11].mNumIndices;
    uVar21 = (ulong)uVar9;
    if (uVar9 == 0) {
LAB_0014f953:
      *(byte *)&mesh->mPrimitiveTypes = (byte)mesh->mPrimitiveTypes | 8;
    }
    else {
      paVar20 = mesh->mFaces + uVar11;
      uVar15 = 1L << ((byte)uVar11 & 0x3f);
      iVar14 = 1;
      uVar19 = 0;
      do {
        uVar9 = (int)uVar19 + 2;
        uVar10 = (ulong)uVar9;
        if ((uint)uVar21 <= uVar9) {
          uVar10 = uVar21;
        }
        if ((uint)uVar21 < 5) {
          uVar10 = uVar21;
        }
        uVar18 = uVar19 + 1;
        if (uVar18 < uVar10) {
          uVar21 = uVar18 & 0xffffffff;
          do {
            paVar5 = mesh->mVertices;
            puVar16 = paVar20->mIndices;
            uVar9 = puVar16[uVar19];
            uVar12 = (uint)uVar21;
            uVar4 = puVar16[uVar21];
            if ((paVar5[uVar9].x == paVar5[uVar4].x) &&
               (!NAN(paVar5[uVar9].x) && !NAN(paVar5[uVar4].x))) {
              if ((paVar5[uVar9].y == paVar5[uVar4].y) &&
                 (!NAN(paVar5[uVar9].y) && !NAN(paVar5[uVar4].y))) {
                if ((paVar5[uVar9].z == paVar5[uVar4].z) &&
                   (!NAN(paVar5[uVar9].z) && !NAN(paVar5[uVar4].z))) {
                  uVar9 = paVar20->mNumIndices - 1;
                  paVar20->mNumIndices = uVar9;
                  if (uVar12 < uVar9) {
                    do {
                      paVar20->mIndices[uVar21] = paVar20->mIndices[uVar21 + 1];
                      uVar21 = uVar21 + 1;
                      uVar17 = (ulong)paVar20->mNumIndices;
                    } while (uVar21 < uVar17);
                    puVar16 = paVar20->mIndices;
                  }
                  else {
                    uVar17 = (ulong)uVar9;
                  }
                  puVar16[uVar17] = 0xdeadbeef;
                  iVar13 = iVar13 + iVar14;
                  if ((char)iVar14 != '\0') {
                    iVar14 = 0;
                  }
                  if (this->mConfigRemoveDegenerates != false) {
                    local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar11 >> 6] =
                         local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [uVar11 >> 6] | uVar15;
                    goto LAB_0014f956;
                  }
                  uVar10 = (ulong)((int)uVar10 - 1);
                  uVar12 = uVar12 - 1;
                }
              }
            }
            uVar21 = (ulong)(uVar12 + 1);
          } while (uVar12 + 1 < (uint)uVar10);
        }
        if ((this->mConfigCheckAreaOfTriangle == true) && (paVar20->mNumIndices == 3)) {
          puVar16 = paVar20->mIndices;
          paVar5 = mesh->mVertices;
          uVar9 = *puVar16;
          uVar4 = puVar16[1];
          fVar25 = paVar5[uVar9].x;
          fVar34 = paVar5[uVar9].y;
          fVar31 = paVar5[uVar9].z;
          fVar24 = paVar5[uVar4].x;
          fVar30 = paVar5[uVar4].y;
          fVar33 = paVar5[uVar4].z;
          uVar9 = puVar16[2];
          fVar1 = paVar5[uVar9].x;
          fVar2 = paVar5[uVar9].y;
          fVar3 = paVar5[uVar9].z;
          fVar23 = fVar24 - fVar25;
          fVar29 = fVar30 - fVar34;
          fVar32 = fVar33 - fVar31;
          dVar26 = pow((double)(fVar32 * fVar32 + fVar23 * fVar23 + fVar29 * fVar29),0.5);
          fVar24 = fVar1 - fVar24;
          fVar30 = fVar2 - fVar30;
          fVar33 = fVar3 - fVar33;
          dVar27 = pow((double)(fVar33 * fVar33 + fVar24 * fVar24 + fVar30 * fVar30),0.5);
          fVar25 = fVar25 - fVar1;
          fVar34 = fVar34 - fVar2;
          fVar31 = fVar31 - fVar3;
          dVar28 = pow((double)(fVar31 * fVar31 + fVar25 * fVar25 + fVar34 * fVar34),0.5);
          fVar25 = ((float)dVar26 + (float)dVar27 + (float)dVar28) * 0.5;
          dVar26 = pow((double)((fVar25 - (float)dVar28) *
                               (fVar25 - (float)dVar27) * (fVar25 - (float)dVar26) * fVar25),0.5);
          if (((float)dVar26 < 1e-06) && (this->mConfigRemoveDegenerates == true)) {
            local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar11 >> 6] =
                 local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar11 >> 6] |
                 uVar15;
            iVar13 = iVar13 + 1;
            goto LAB_0014f956;
          }
        }
        uVar9 = paVar20->mNumIndices;
        uVar21 = (ulong)uVar9;
        uVar19 = uVar18;
      } while (uVar18 < uVar21);
      if (uVar9 == 3) {
        *(byte *)&mesh->mPrimitiveTypes = (byte)mesh->mPrimitiveTypes | 4;
      }
      else if (uVar9 == 2) {
        *(byte *)&mesh->mPrimitiveTypes = (byte)mesh->mPrimitiveTypes | 2;
      }
      else {
        if (uVar9 != 1) goto LAB_0014f953;
        *(byte *)&mesh->mPrimitiveTypes = (byte)mesh->mPrimitiveTypes | 1;
      }
    }
LAB_0014f956:
    uVar11 = uVar11 + 1;
  } while (uVar11 < mesh->mNumFaces);
  if ((this->mConfigRemoveDegenerates == true) && (iVar13 != 0)) {
    if (mesh->mNumFaces != 0) {
      uVar21 = 0;
      lVar22 = 8;
      uVar11 = 0;
      do {
        paVar20 = mesh->mFaces;
        if ((local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0) {
          uVar19 = (ulong)((int)uVar11 + 1);
          paVar20[uVar11].mNumIndices = *(uint *)((long)paVar20 + lVar22 + -8);
          paVar20[uVar11].mIndices = *(uint **)((long)&paVar20->mNumIndices + lVar22);
          if (uVar21 != uVar11) {
            *(undefined4 *)((long)paVar20 + lVar22 + -8) = 0;
            *(undefined8 *)((long)&paVar20->mNumIndices + lVar22) = 0;
          }
        }
        else {
          pvVar6 = *(void **)((long)&paVar20->mNumIndices + lVar22);
          if (pvVar6 != (void *)0x0) {
            operator_delete__(pvVar6);
          }
          *(undefined8 *)((long)&paVar20->mNumIndices + lVar22) = 0;
          *(undefined4 *)((long)paVar20 + lVar22 + -8) = 0;
          uVar19 = uVar11;
        }
        uVar21 = uVar21 + 1;
        lVar22 = lVar22 + 0x10;
        uVar11 = uVar19;
      } while (uVar21 < mesh->mNumFaces);
      mesh->mNumFaces = (uint)uVar19;
      if ((uint)uVar19 != 0) goto LAB_0014fa47;
    }
    pLVar8 = DefaultLogger::get();
    Logger::debug(pLVar8,"FindDegeneratesProcess removed a mesh full of degenerated primitives");
    bVar7 = true;
  }
  else {
LAB_0014fa47:
    if ((iVar13 != 0) && (bVar7 = DefaultLogger::isNullLogger(), !bVar7)) {
      pLVar8 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[7]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [7])0x1f22c8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," degenerated primitives",0x17);
      std::__cxx11::stringbuf::str();
      Logger::warn(pLVar8,local_1c8);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
    bVar7 = false;
  }
LAB_0014fb10:
  if (local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return bVar7;
}

Assistant:

bool FindDegeneratesProcess::ExecuteOnMesh( aiMesh* mesh) {
    mesh->mPrimitiveTypes = 0;

    std::vector<bool> remove_me;
    if (mConfigRemoveDegenerates) {
        remove_me.resize( mesh->mNumFaces, false );
    }

    unsigned int deg = 0, limit;
    for ( unsigned int a = 0; a < mesh->mNumFaces; ++a ) {
        aiFace& face = mesh->mFaces[a];
        bool first = true;

        // check whether the face contains degenerated entries
        for (unsigned int i = 0; i < face.mNumIndices; ++i) {
            // Polygons with more than 4 points are allowed to have double points, that is
            // simulating polygons with holes just with concave polygons. However,
            // double points may not come directly after another.
            limit = face.mNumIndices;
            if (face.mNumIndices > 4) {
                limit = std::min( limit, i+2 );
            }

            for (unsigned int t = i+1; t < limit; ++t) {
                if (mesh->mVertices[face.mIndices[ i ] ] == mesh->mVertices[ face.mIndices[ t ] ]) {
                    // we have found a matching vertex position
                    // remove the corresponding index from the array
                    --face.mNumIndices;
                    --limit;
                    for (unsigned int m = t; m < face.mNumIndices; ++m) {
                        face.mIndices[ m ] = face.mIndices[ m+1 ];
                    }
                    --t;

                    // NOTE: we set the removed vertex index to an unique value
                    // to make sure the developer gets notified when his
                    // application attempts to access this data.
                    face.mIndices[ face.mNumIndices ] = 0xdeadbeef;

                    if(first) {
                        ++deg;
                        first = false;
                    }

                    if ( mConfigRemoveDegenerates ) {
                        remove_me[ a ] = true;
                        goto evil_jump_outside; // hrhrhrh ... yeah, this rocks baby!
                    }
                }
            }

            if ( mConfigCheckAreaOfTriangle ) {
                if ( face.mNumIndices == 3 ) {
                    ai_real area = calculateAreaOfTriangle( face, mesh );
                    if ( area < 1e-6 ) {
                        if ( mConfigRemoveDegenerates ) {
                            remove_me[ a ] = true;
                            ++deg;
                            goto evil_jump_outside;
                        }

                        // todo: check for index which is corrupt.
                    }
                }
            }
        }

        // We need to update the primitive flags array of the mesh.
        switch (face.mNumIndices)
        {
        case 1u:
            mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
            break;
        case 2u:
            mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
            break;
        case 3u:
            mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
            break;
        default:
            mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
            break;
        };
evil_jump_outside:
        continue;
    }

    // If AI_CONFIG_PP_FD_REMOVE is true, remove degenerated faces from the import
    if (mConfigRemoveDegenerates && deg) {
        unsigned int n = 0;
        for (unsigned int a = 0; a < mesh->mNumFaces; ++a)
        {
            aiFace& face_src = mesh->mFaces[a];
            if (!remove_me[a]) {
                aiFace& face_dest = mesh->mFaces[n++];

                // Do a manual copy, keep the index array
                face_dest.mNumIndices = face_src.mNumIndices;
                face_dest.mIndices    = face_src.mIndices;

                if (&face_src != &face_dest) {
                    // clear source
                    face_src.mNumIndices = 0;
                    face_src.mIndices = nullptr;
                }
            }
            else {
                // Otherwise delete it if we don't need this face
                delete[] face_src.mIndices;
                face_src.mIndices = nullptr;
                face_src.mNumIndices = 0;
            }
        }
        // Just leave the rest of the array unreferenced, we don't care for now
        mesh->mNumFaces = n;
        if (!mesh->mNumFaces) {
            //The whole mesh consists of degenerated faces
            //signal upward, that this mesh should be deleted.
            ASSIMP_LOG_DEBUG("FindDegeneratesProcess removed a mesh full of degenerated primitives");
            return true;
        }
    }

    if (deg && !DefaultLogger::isNullLogger()) {
        ASSIMP_LOG_WARN_F( "Found ", deg, " degenerated primitives");
    }
    return false;
}